

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemdelegate.cpp
# Opt level: O0

bool __thiscall
QAbstractItemDelegatePrivate::handleEditorEvent
          (QAbstractItemDelegatePrivate *this,QObject *object,QEvent *event)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  QWidget *pQVar6;
  ulong uVar7;
  QWidget *pQVar8;
  QPlatformIntegration *pQVar9;
  long lVar10;
  socklen_t *in_RCX;
  QWidget *in_RDX;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  bool manuallyFixFocus;
  QWidget *editorParent;
  QPlatformDrag *platformDrag;
  QWidget *w;
  QKeyEvent *keyEvent;
  QAbstractItemDelegate *q;
  QWidget *editor;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  QWidget *in_stack_ffffffffffffff70;
  EndEditHint EVar12;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  ConnectionType in_stack_ffffffffffffff8c;
  uint uVar13;
  char *in_stack_ffffffffffffff90;
  QObject *in_stack_ffffffffffffff98;
  QWidget *local_60;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func((QAbstractItemDelegatePrivate *)in_RDI);
  pQVar6 = qobject_cast<QWidget*>
                     ((QObject *)
                      CONCAT17(in_stack_ffffffffffffff6f,
                               CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  if (pQVar6 == (QWidget *)0x0) {
    local_29 = false;
  }
  else {
    TVar4 = QEvent::type((QEvent *)in_RDX);
    if (TVar4 == KeyPress) {
      bVar2 = editorHandlesKeyEvent
                        ((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (QKeyEvent *)in_stack_ffffffffffffff70);
      EVar12 = (EndEditHint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      if (bVar2) {
        local_29 = false;
      }
      else {
        uVar7 = QKeyEvent::matches((StandardKey)in_RDX);
        if ((uVar7 & 1) == 0) {
          iVar5 = QKeyEvent::key((QKeyEvent *)in_RDX);
          if (iVar5 == 0x1000001) {
            bVar2 = tryFixup((QAbstractItemDelegatePrivate *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
            if (bVar2) {
              QAbstractItemDelegate::commitData
                        ((QAbstractItemDelegate *)0x7fd3a2,
                         (QWidget *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
              QAbstractItemDelegate::closeEditor
                        ((QAbstractItemDelegate *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                         (QWidget *)CONCAT44(iVar5,in_stack_ffffffffffffff78),EVar12);
            }
            local_29 = true;
          }
          else if (iVar5 == 0x1000002) {
            bVar2 = tryFixup((QAbstractItemDelegatePrivate *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
            if (bVar2) {
              QAbstractItemDelegate::commitData
                        ((QAbstractItemDelegate *)0x7fd3ed,
                         (QWidget *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
              QAbstractItemDelegate::closeEditor
                        ((QAbstractItemDelegate *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                         (QWidget *)CONCAT44(iVar5,in_stack_ffffffffffffff78),EVar12);
            }
            local_29 = true;
          }
          else if (iVar5 + 0xfefffffcU < 2) {
            bVar2 = tryFixup((QAbstractItemDelegatePrivate *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
            if (bVar2) {
              QtPrivate::Invoke::argument<QWidget*>
                        ((char *)in_RDI,(QWidget **)CONCAT44(iVar5,in_stack_ffffffffffffff78));
              QMetaObject::invokeMethod<QMetaMethodArgument>
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8c,(QMetaMethodArgument *)in_RDI);
              local_29 = false;
            }
            else {
              local_29 = true;
            }
          }
          else {
            local_29 = false;
          }
        }
        else {
          QAbstractItemDelegate::closeEditor
                    ((QAbstractItemDelegate *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                     (QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),EVar12
                    );
          local_29 = true;
        }
      }
    }
    else {
      TVar4 = QEvent::type((QEvent *)in_RDX);
      if ((TVar4 == FocusOut) ||
         ((TVar4 = QEvent::type((QEvent *)in_RDX), TVar4 == Hide &&
          (bVar2 = QWidget::isWindow(in_stack_ffffffffffffff70), bVar2)))) {
        bVar2 = QWidget::isActiveWindow(in_RDX);
        if ((!bVar2) || (pQVar8 = QApplication::focusWidget(), pQVar8 != pQVar6)) {
          local_60 = QApplication::focusWidget();
          while (EVar12 = (EndEditHint)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                local_60 != (QWidget *)0x0) {
            if (local_60 == pQVar6) {
              local_29 = false;
              goto LAB_007fd656;
            }
            local_60 = QWidget::parentWidget((QWidget *)0x7fd513);
          }
          QGuiApplicationPrivate::instance();
          pQVar9 = QGuiApplicationPrivate::platformIntegration();
          lVar10 = (**(code **)(*(long *)pQVar9 + 0x78))();
          if ((lVar10 != 0) && (lVar10 = QPlatformDrag::currentDrag(), lVar10 != 0)) {
            local_29 = false;
            goto LAB_007fd656;
          }
          bVar2 = tryFixup((QAbstractItemDelegatePrivate *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
          if (bVar2) {
            QAbstractItemDelegate::commitData
                      ((QAbstractItemDelegate *)0x7fd57e,
                       (QWidget *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
          }
          pQVar6 = QWidget::parentWidget((QWidget *)0x7fd58b);
          TVar4 = QEvent::type((QEvent *)in_RDX);
          bVar2 = false;
          if (TVar4 == FocusOut) {
            bVar3 = QWidget::hasFocus((QWidget *)
                                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
            ;
            bVar2 = false;
            if ((!bVar3) && (bVar2 = false, pQVar6 != (QWidget *)0x0)) {
              iVar5 = QFocusEvent::reason();
              bVar2 = iVar5 == 3;
            }
          }
          uVar13 = (uint)bVar2 << 0x18;
          QAbstractItemDelegate::closeEditor
                    ((QAbstractItemDelegate *)
                     CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                     (QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),EVar12
                    );
          if ((uVar13 & 0x1000000) != 0) {
            QWidget::setFocus((QWidget *)0x7fd612);
          }
        }
      }
      else {
        TVar4 = QEvent::type((QEvent *)in_RDX);
        if (TVar4 == ShortcutOverride) {
          iVar5 = 0x46;
          auVar11 = QKeyEvent::matches((StandardKey)in_RDX);
          if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            QEvent::accept((QEvent *)in_RDX,iVar5,auVar11._8_8_,in_RCX);
            local_29 = true;
            goto LAB_007fd656;
          }
        }
      }
      local_29 = false;
    }
  }
LAB_007fd656:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QAbstractItemDelegatePrivate::handleEditorEvent(QObject *object, QEvent *event)
{
    Q_Q(QAbstractItemDelegate);

    QWidget *editor = qobject_cast<QWidget*>(object);
    if (!editor)
        return false;
    if (event->type() == QEvent::KeyPress) {
        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        if (editorHandlesKeyEvent(editor, keyEvent))
            return false;

#ifndef QT_NO_SHORTCUT
        if (keyEvent->matches(QKeySequence::Cancel)) {
            // don't commit data
            emit q->closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
            return true;
        }
#endif

        switch (keyEvent->key()) {
        case Qt::Key_Tab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditNextItem);
            }
            return true;
        case Qt::Key_Backtab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditPreviousItem);
            }
            return true;
        case Qt::Key_Enter:
        case Qt::Key_Return:
            // We want the editor to be able to process the key press
            // before committing the data (e.g. so it can do
            // validation/fixup of the input).
            if (!tryFixup(editor))
                return true;

            QMetaObject::invokeMethod(q, "_q_commitDataAndCloseEditor",
                                      Qt::QueuedConnection, Q_ARG(QWidget*, editor));
            return false;
        default:
            return false;
        }
    } else if (event->type() == QEvent::FocusOut || (event->type() == QEvent::Hide && editor->isWindow())) {
        //the Hide event will take care of he editors that are in fact complete dialogs
        if (!editor->isActiveWindow() || (QApplication::focusWidget() != editor)) {
            QWidget *w = QApplication::focusWidget();
            while (w) { // don't worry about focus changes internally in the editor
                if (w == editor)
                    return false;
                w = w->parentWidget();
            }
#if QT_CONFIG(draganddrop)
            // The window may lose focus during an drag operation.
            // i.e when dragging involves the taskbar on Windows.
            QPlatformDrag *platformDrag = QGuiApplicationPrivate::instance()->platformIntegration()->drag();
            if (platformDrag && platformDrag->currentDrag()) {
                return false;
            }
#endif
            if (tryFixup(editor))
                emit q->commitData(editor);

            // If the application loses focus while editing, then the focus needs to go back
            // to the itemview when the editor closes. This ensures that when the application
            // is active again it will have the focus on the itemview as expected.
            QWidget *editorParent = editor->parentWidget();
            const bool manuallyFixFocus = (event->type() == QEvent::FocusOut) && !editor->hasFocus() &&
                    editorParent &&
                    (static_cast<QFocusEvent *>(event)->reason() == Qt::ActiveWindowFocusReason);
            emit q->closeEditor(editor, QAbstractItemDelegate::NoHint);
            if (manuallyFixFocus)
                editorParent->setFocus();
        }
#ifndef QT_NO_SHORTCUT
    } else if (event->type() == QEvent::ShortcutOverride) {
        if (static_cast<QKeyEvent*>(event)->matches(QKeySequence::Cancel)) {
            event->accept();
            return true;
        }
#endif
    }
    return false;
}